

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  buffer<char> *pbVar11;
  int iVar12;
  result rVar13;
  size_t sVar14;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  char cVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  size_t __len;
  ulong uVar26;
  boundaries bVar27;
  int exp;
  fixed_handler handler;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  fixed_handler local_78;
  buffer<char> *local_60;
  double local_58;
  fp local_50;
  uint64_t local_40;
  float_specs local_38;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x431,"value is negative");
  }
  uVar15 = (ulong)(uint)precision;
  uVar19 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (0 < precision && uVar19 == 0x200000000) {
      if (buf->capacity_ < uVar15) {
        (**buf->_vptr_buffer)(buf,uVar15);
      }
      buf->size_ = uVar15;
      memset(buf->ptr_,0x30,uVar15);
      return -precision;
    }
    sVar14 = buf->size_;
    uVar15 = sVar14 + 1;
    if (buf->capacity_ < uVar15) {
      (**buf->_vptr_buffer)(buf);
      sVar14 = buf->size_;
      uVar15 = sVar14 + 1;
    }
    buf->size_ = uVar15;
    buf->ptr_[sVar14] = '0';
    return 0;
  }
  if ((specs._4_4_ >> 0x13 & 1) == 0) {
    iVar12 = snprintf_float<double>(value,precision,specs,buf);
    return iVar12;
  }
  local_8c = 0;
  if (precision < 0) {
    local_50.f = 0;
    local_50.e = 0;
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      local_58 = value;
      bVar27 = fp::assign_with_boundaries<double>(&local_50,value);
    }
    else {
      local_58 = value;
      bVar27 = fp::assign_float_with_boundaries<double>(&local_50,value);
    }
    if ((local_50.f >> 0x34 & 1) == 0) {
      lVar18 = 0x3f;
      if ((local_50.f & 0xfffffffffffff) != 0) {
        for (; (local_50.f & 0xfffffffffffff) >> lVar18 == 0; lVar18 = lVar18 + -1) {
        }
      }
      local_50.f = local_50.f << (~(byte)lVar18 + 0x35 & 0x3f);
      local_50.e = (local_50.e - ((uint)lVar18 ^ 0x3f)) + 0xb;
    }
    iVar12 = (int)((ulong)((long)(-0x32 - local_50.e) * 0x4d104d42 + 0xffffffff) >> 0x20);
    uVar17 = iVar12 + 0x15b;
    uVar22 = iVar12 + 0x162;
    if (-1 < (int)uVar17) {
      uVar22 = uVar17;
    }
    uVar15 = *(ulong *)(basic_data<void>::pow10_significands + (long)((int)uVar22 >> 3) * 8 + 8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar15;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_50.f << 0xb;
    local_50.f = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
    iVar12 = local_50.e +
             *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar22 >> 3) * 2 + 2) + 0x35
    ;
    if (0x1c < local_50.e +
               *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar22 >> 3) * 2 + 2) +
               0x71U) {
      local_50.e = iVar12;
      __assert_fail("min_exp <= fp_value.e && fp_value.e <= -32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                    ,0x451,
                    "int fmt::detail::format_float(T, int, float_specs, buffer<char> &) [T = double]"
                   );
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar15;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = bVar27.upper;
    lVar18 = SUB168(auVar3 * auVar7,8);
    lVar23 = -(SUB168(auVar3 * auVar7,0) >> 0x3f);
    uVar26 = lVar18 + lVar23 + 1;
    local_78.buf = buf->ptr_;
    local_78._16_8_ = uVar26 - local_50.f;
    bVar16 = -(char)iVar12;
    uVar24 = 1L << (bVar16 & 0x3f);
    uVar19 = uVar26 >> (bVar16 & 0x3f);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar15;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = bVar27.lower;
    local_78.size = 0;
    uVar17 = (uint)uVar19;
    local_50.e = iVar12;
    if (uVar17 == 0) {
LAB_001112c0:
      local_78.size = 0;
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                  ,0x330,"");
    }
    local_80 = uVar24 - 1;
    local_8c = 1;
    if (((((9 < uVar17) && (local_8c = 2, 99 < uVar17)) && (local_8c = 3, 999 < uVar17)) &&
        ((local_8c = 4, 9999 < uVar17 && (local_8c = 5, 99999 < uVar17)))) &&
       ((local_8c = 6, 999999 < uVar17 &&
        ((local_8c = 7, 9999999 < uVar17 && (local_8c = 8, 99999999 < uVar17)))))) {
      local_8c = 10 - (uVar17 < 1000000000);
    }
    local_88 = (ulong)((uVar22 & 0xfffffff8) + 8);
    uVar25 = ((SUB168(auVar4 * auVar8,0) >> 0x3f) - SUB168(auVar4 * auVar8,8)) + lVar18 + lVar23 + 2
    ;
    uVar26 = uVar26 & local_80;
    local_60 = buf;
    do {
      uVar22 = local_8c - 1;
      switch((ulong)uVar22) {
      case 0:
        cVar20 = (char)uVar19;
        uVar19 = 0;
        goto LAB_00110d56;
      case 1:
        cVar20 = (char)((uVar19 & 0xffffffff) / 10);
        iVar12 = (int)((uVar19 & 0xffffffff) / 10) * 10;
        break;
      case 2:
        cVar20 = (char)((uVar19 & 0xffffffff) / 100);
        iVar12 = (int)((uVar19 & 0xffffffff) / 100) * 100;
        break;
      case 3:
        cVar20 = (char)((uVar19 & 0xffffffff) / 1000);
        iVar12 = (int)((uVar19 & 0xffffffff) / 1000) * 1000;
        break;
      case 4:
        cVar20 = (char)((uVar19 & 0xffffffff) / 10000);
        iVar12 = (int)((uVar19 & 0xffffffff) / 10000) * 10000;
        break;
      case 5:
        uVar15 = uVar19 >> 5 & 0x7ffffff;
        cVar20 = (char)(uVar15 / 0xc35);
        iVar12 = (int)(uVar15 / 0xc35) * 100000;
        break;
      case 6:
        cVar20 = (char)((uVar19 & 0xffffffff) / 1000000);
        iVar12 = (int)((uVar19 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 7:
        cVar20 = (char)((uVar19 & 0xffffffff) / 10000000);
        iVar12 = (int)((uVar19 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 8:
        cVar20 = (char)((uVar19 & 0xffffffff) / 100000000);
        iVar12 = (int)((uVar19 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 9:
        uVar15 = (uVar19 >> 9 & 0x7fffff) * 0x44b83;
        cVar20 = (char)(uVar15 >> 0x27);
        iVar12 = (uint)(uVar15 >> 0x27) * 1000000000;
        break;
      default:
        goto switchD_00111037_default;
      }
      uVar19 = (ulong)(uint)((int)uVar19 - iVar12);
LAB_00110d56:
      local_8c = uVar22;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_78,cVar20 + '0',
                          (&basic_data<void>::powers_of_10_64)[uVar22] << (bVar16 & 0x3f),
                          (uVar19 << (bVar16 & 0x3f)) + uVar26,uVar25,uVar22,true);
      uVar15 = local_80;
      if (rVar13 != more) goto LAB_00110dfb;
    } while (0 < (int)local_8c);
    do {
      uVar19 = uVar26 * 10;
      uVar25 = uVar25 * 10;
      uVar26 = uVar19 & uVar15;
      local_8c = local_8c - 1;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_78,
                          (char)(uVar19 >> (bVar16 & 0x3f)) + '0',uVar24,uVar26,uVar25,local_8c,
                          false);
    } while (rVar13 == more);
LAB_00110dfb:
    pbVar11 = local_60;
    uVar15 = (ulong)(uint)local_78.size;
    if (rVar13 == error) {
      local_8c = local_8c + (local_78.size - (int)local_88) + 0x15b;
      fallback_format<double>(local_58,local_60,(int *)&local_8c);
      return local_8c;
    }
    if (local_78.size < 0) {
LAB_00111213:
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/core.h"
                  ,0x13d,"negative value");
    }
    if (local_60->capacity_ < uVar15) {
      (**local_60->_vptr_buffer)(local_60,uVar15);
    }
    pbVar11->size_ = uVar15;
    iVar12 = (int)local_88;
LAB_00111273:
    iVar12 = (local_8c - iVar12) + 0x15c;
  }
  else {
    if ((uint)precision < 0x12) {
      uVar15 = (ulong)value & 0xfffffffffffff;
      if ((ulong)value >> 0x34 == 0) {
        lVar18 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar18 == 0; lVar18 = lVar18 + -1) {
          }
        }
        uVar15 = uVar15 << (~(byte)lVar18 + 0x35 & 0x3f);
        iVar12 = ((uint)lVar18 ^ 0xffffffc0) - 0x426;
      }
      else {
        uVar15 = uVar15 | 0x10000000000000;
        iVar12 = (uint)((ulong)value >> 0x34) - 0x433;
      }
      iVar10 = (int)((ulong)((long)(-0x32 - iVar12) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar17 = iVar10 + 0x15b;
      uVar22 = iVar10 + 0x162;
      if (-1 < (int)uVar17) {
        uVar22 = uVar17;
      }
      local_88 = (ulong)(uVar22 & 0xfffffff8);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar15 << 0xb;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(basic_data<void>::pow10_significands +
                               (long)((int)uVar22 >> 3) * 8 + 8);
      uVar26 = SUB168(auVar5 * auVar9,8) - (SUB168(auVar5 * auVar9,0) >> 0x3f);
      bVar16 = -((char)*(undefined2 *)
                        (basic_data<void>::pow10_exponents + (long)((int)uVar22 >> 3) * 2 + 2) +
                (char)iVar12) - 0x35;
      local_78.buf = buf->ptr_;
      local_78.size = 0;
      local_40 = 1L << (bVar16 & 0x3f);
      local_78.fixed = uVar19 == 0x200000000;
      local_78.exp10 = 0x154 - (uVar22 & 0xfffffff8);
      uVar15 = uVar26 >> (bVar16 & 0x3f);
      uVar22 = (uint)uVar15;
      local_78.precision = precision;
      local_60 = buf;
      local_38 = specs;
      if (uVar22 == 0) goto LAB_001112c0;
      if (uVar15 >> 0x20 != 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                    ,0x331,"");
      }
      local_8c = 1;
      if ((((9 < uVar22) && (local_8c = 2, 99 < uVar22)) && (local_8c = 3, 999 < uVar22)) &&
         (((local_8c = 4, 9999 < uVar22 && (local_8c = 5, 99999 < uVar22)) &&
          ((local_8c = 6, 999999 < uVar22 &&
           ((local_8c = 7, 9999999 < uVar22 && (local_8c = 8, 99999999 < uVar22)))))))) {
        local_8c = 10 - (uVar22 < 1000000000);
      }
      local_58 = value;
      rVar13 = fixed_handler::on_start
                         (&local_78,
                          (&basic_data<void>::powers_of_10_64)[local_8c - 1] << (bVar16 & 0x3f),
                          uVar26 / 10,10,(int *)&local_8c);
      if (rVar13 == more) {
        local_80 = local_40 - 1;
        uVar26 = uVar26 & local_80;
        do {
          uVar22 = local_8c - 1;
          switch((ulong)uVar22) {
          case 0:
            cVar20 = (char)uVar15;
            uVar15 = 0;
            goto LAB_0011111b;
          case 1:
            cVar20 = (char)((uVar15 & 0xffffffff) / 10);
            iVar12 = (int)((uVar15 & 0xffffffff) / 10) * 10;
            break;
          case 2:
            cVar20 = (char)((uVar15 & 0xffffffff) / 100);
            iVar12 = (int)((uVar15 & 0xffffffff) / 100) * 100;
            break;
          case 3:
            cVar20 = (char)((uVar15 & 0xffffffff) / 1000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 1000) * 1000;
            break;
          case 4:
            cVar20 = (char)((uVar15 & 0xffffffff) / 10000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 10000) * 10000;
            break;
          case 5:
            uVar21 = uVar15 >> 5 & 0x7ffffff;
            cVar20 = (char)(uVar21 / 0xc35);
            iVar12 = (int)(uVar21 / 0xc35) * 100000;
            break;
          case 6:
            cVar20 = (char)((uVar15 & 0xffffffff) / 1000000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 7:
            cVar20 = (char)((uVar15 & 0xffffffff) / 10000000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 8:
            cVar20 = (char)((uVar15 & 0xffffffff) / 100000000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 9:
            uVar21 = (uVar15 >> 9 & 0x7fffff) * 0x44b83;
            cVar20 = (char)(uVar21 >> 0x27);
            iVar12 = (uint)(uVar21 >> 0x27) * 1000000000;
            break;
          default:
switchD_00111037_default:
            assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                        ,0x363,"invalid number of digits");
          }
          uVar15 = (ulong)(uint)((int)uVar15 - iVar12);
LAB_0011111b:
          local_8c = uVar22;
          rVar13 = fixed_handler::on_digit
                             (&local_78,cVar20 + '0',
                              (&basic_data<void>::powers_of_10_64)[uVar22] << (bVar16 & 0x3f),
                              (uVar15 << (bVar16 & 0x3f)) + uVar26,1,uVar22,true);
          uVar24 = local_40;
          if (rVar13 != more) goto LAB_001111c7;
        } while (0 < (int)local_8c);
        uVar25 = 1;
        do {
          uVar15 = uVar26 * 10;
          uVar25 = uVar25 * 10;
          uVar26 = uVar15 & local_80;
          local_8c = local_8c - 1;
          rVar13 = fixed_handler::on_digit
                             (&local_78,(char)(uVar15 >> (bVar16 & 0x3f)) + '0',uVar24,uVar26,uVar25
                              ,local_8c,false);
        } while (rVar13 == more);
      }
LAB_001111c7:
      pbVar11 = local_60;
      buf = local_60;
      specs = local_38;
      value = local_58;
      if (rVar13 != error) {
        uVar15 = (ulong)(uint)local_78.size;
        if (local_78.size < 1 || uVar19 == 0x200000000) {
          if (local_78.size < 0) goto LAB_00111213;
        }
        else {
          uVar15 = (ulong)(uint)local_78.size;
          do {
            uVar22 = local_8c + 1;
            if (local_60->ptr_[uVar15 - 1] != '0') goto LAB_00111258;
            bVar1 = 1 < uVar15;
            uVar15 = uVar15 - 1;
            local_8c = uVar22;
          } while (bVar1);
          uVar15 = 0;
        }
LAB_00111258:
        iVar12 = (int)local_88;
        uVar15 = uVar15 & 0xffffffff;
        if (local_60->capacity_ < uVar15) {
          (**local_60->_vptr_buffer)(local_60,uVar15);
        }
        iVar12 = iVar12 + 8;
        pbVar11->size_ = uVar15;
        goto LAB_00111273;
      }
    }
    iVar12 = snprintf_float<double>(value,precision,specs,buf);
  }
  return iVar12;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}